

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O0

int sign_frommemory(LIBSSH2_SESSION *session,uchar **sig,size_t *sig_len,uchar *data,size_t data_len
                   ,void **abstract)

{
  uchar *method;
  size_t method_len;
  char *privkeyfiledata;
  int iVar1;
  size_t privkeyfiledata_len;
  size_t sStack_68;
  int rc;
  iovec datavec;
  void *hostkey_abstract;
  LIBSSH2_HOSTKEY_METHOD *privkeyobj;
  privkey_file *pk_file;
  void **abstract_local;
  size_t data_len_local;
  uchar *data_local;
  size_t *sig_len_local;
  uchar **sig_local;
  LIBSSH2_SESSION *session_local;
  
  privkeyobj = (LIBSSH2_HOSTKEY_METHOD *)*abstract;
  method = session->userauth_pblc_method;
  method_len = session->userauth_pblc_method_len;
  privkeyfiledata = privkeyobj->name;
  pk_file = (privkey_file *)abstract;
  abstract_local = (void **)data_len;
  data_len_local = (size_t)data;
  data_local = (uchar *)sig_len;
  sig_len_local = (size_t *)sig;
  sig_local = (uchar **)session;
  privkeyfiledata_len = strlen(privkeyobj->name);
  session_local._4_4_ =
       memory_read_privatekey
                 (session,(LIBSSH2_HOSTKEY_METHOD **)&hostkey_abstract,(void **)&datavec.iov_len,
                  method,method_len,privkeyfiledata,privkeyfiledata_len,(char *)privkeyobj->hash_len
                 );
  if (session_local._4_4_ == 0) {
    sStack_68 = data_len_local;
    datavec.iov_base = abstract_local;
    iVar1 = (**(code **)((long)hostkey_abstract + 0x30))
                      (sig_local,sig_len_local,data_local,1,&stack0xffffffffffffff98,
                       &datavec.iov_len);
    if (iVar1 == 0) {
      if (*(long *)((long)hostkey_abstract + 0x40) != 0) {
        (**(code **)((long)hostkey_abstract + 0x40))(sig_local,&datavec.iov_len);
      }
      session_local._4_4_ = 0;
    }
    else {
      if (*(long *)((long)hostkey_abstract + 0x40) != 0) {
        (**(code **)((long)hostkey_abstract + 0x40))(sig_local,&datavec.iov_len);
      }
      session_local._4_4_ = -1;
    }
  }
  return session_local._4_4_;
}

Assistant:

static int
sign_frommemory(LIBSSH2_SESSION *session, unsigned char **sig, size_t *sig_len,
                const unsigned char *data, size_t data_len, void **abstract)
{
    struct privkey_file *pk_file = (struct privkey_file *) (*abstract);
    const LIBSSH2_HOSTKEY_METHOD *privkeyobj;
    void *hostkey_abstract;
    struct iovec datavec;
    int rc;

    rc = memory_read_privatekey(session, &privkeyobj, &hostkey_abstract,
                                session->userauth_pblc_method,
                                session->userauth_pblc_method_len,
                                pk_file->filename,
                                strlen(pk_file->filename),
                                pk_file->passphrase);
    if(rc)
        return rc;

    libssh2_prepare_iovec(&datavec, 1);
    datavec.iov_base = (void *)data;
    datavec.iov_len  = data_len;

    if(privkeyobj->signv(session, sig, sig_len, 1, &datavec,
                         &hostkey_abstract)) {
        if(privkeyobj->dtor) {
            privkeyobj->dtor(session, &hostkey_abstract);
        }
        return -1;
    }

    if(privkeyobj->dtor) {
        privkeyobj->dtor(session, &hostkey_abstract);
    }
    return 0;
}